

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCallTransitions.cpp
# Opt level: O0

void BubbleSortArray(NULLCArray arr,NULLCFuncPtr comparator)

{
  undefined4 uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  int tmp;
  uint local_50;
  uint local_4c;
  uint l;
  uint k;
  int *elem;
  NULLCFuncPtr comparator_local;
  NULLCArray arr_local;
  
  pcVar4 = arr.ptr;
  for (local_4c = 0; local_50 = arr.len, local_4c < arr.len; local_4c = local_4c + 1) {
    while (uVar2 = local_50, local_50 = uVar2 - 1, local_4c < local_50) {
      nullcCallFunction(comparator.context,(ulong)comparator.id,
                        (ulong)*(uint *)(pcVar4 + (ulong)local_50 * 4),
                        (ulong)*(uint *)(pcVar4 + (ulong)(uVar2 - 2) * 4));
      iVar3 = nullcGetResultInt();
      if (iVar3 != 0) {
        uVar1 = *(undefined4 *)(pcVar4 + (ulong)local_50 * 4);
        *(undefined4 *)(pcVar4 + (ulong)local_50 * 4) =
             *(undefined4 *)(pcVar4 + (ulong)(uVar2 - 2) * 4);
        *(undefined4 *)(pcVar4 + (ulong)(uVar2 - 2) * 4) = uVar1;
      }
    }
  }
  return;
}

Assistant:

void BubbleSortArray(NULLCArray arr, NULLCFuncPtr comparator)
{
	int *elem = (int*)arr.ptr;

	for(unsigned int k = 0; k < arr.len; k++)
	{
		for(unsigned int l = arr.len-1; l > k; l--)
		{
			nullcCallFunction(comparator, elem[l], elem[l-1]);
			if(nullcGetResultInt())
			{
				int tmp = elem[l];
				elem[l] = elem[l-1];
				elem[l-1] = tmp;
			}
		}
	}
}